

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int lookupName(Parse *pParse,char *zDb,char *zTab,char *zCol,NameContext *pNC,Expr *pExpr)

{
  short sVar1;
  sqlite3 *db_00;
  short *psVar2;
  Table *pTVar3;
  ExprList *pEVar4;
  Expr *pEList_00;
  bool bVar5;
  bool bVar6;
  u8 uVar7;
  ynVar yVar8;
  int iVar9;
  int iVar10;
  char *pcVar11;
  uint local_10c;
  uint local_108;
  char *local_100;
  int n;
  char *zErr;
  Expr *pOrig;
  char *zAs;
  Column *pCol_1;
  Table *pTStack_c8;
  int iCol;
  Table *pTab_1;
  int op;
  char *zTabName;
  Column *pCStack_a8;
  int hit;
  Column *pCol;
  Table *pTab;
  SrcList *pSrcList;
  ExprList *pEList;
  Schema *pSStack_80;
  int isTrigger;
  Schema *pSchema;
  NameContext *pTopNC;
  SrcList_item *pMatch;
  SrcList_item *pItem;
  sqlite3 *db;
  int local_50;
  int nSubquery;
  int cntTab;
  int cnt;
  int j;
  int i;
  Expr *pExpr_local;
  NameContext *pNC_local;
  char *zCol_local;
  char *zTab_local;
  char *zDb_local;
  Parse *pParse_local;
  
  nSubquery = 0;
  local_50 = 0;
  db._4_4_ = 0;
  db_00 = pParse->db;
  pTopNC = (NameContext *)0x0;
  pSStack_80 = (Schema *)0x0;
  bVar6 = false;
  pExpr->iTable = -1;
  pExpr->pTab = (Table *)0x0;
  pExpr_local = (Expr *)pNC;
  if (zDb != (char *)0x0) {
    for (cnt = 0; cnt < db_00->nDb; cnt = cnt + 1) {
      iVar9 = sqlite3_stricmp(db_00->aDb[cnt].zName,zDb);
      if (iVar9 == 0) {
        pSStack_80 = db_00->aDb[cnt].pSchema;
        break;
      }
    }
  }
  do {
    if (pExpr_local == (Expr *)0x0 || nSubquery != 0) {
      if (((nSubquery == 0) && (zTab == (char *)0x0)) && ((pExpr->flags & 0x40) == 0x40)) {
        pExpr->op = '^';
        pExpr->pTab = (Table *)0x0;
        pParse_local._4_4_ = 1;
      }
      else {
        if (nSubquery != 1) {
          pcVar11 = "ambiguous column name";
          if (nSubquery == 0) {
            pcVar11 = "no such column";
          }
          if (zDb == (char *)0x0) {
            if (zTab == (char *)0x0) {
              sqlite3ErrorMsg(pParse,"%s: %s",pcVar11,zCol);
            }
            else {
              sqlite3ErrorMsg(pParse,"%s: %s.%s",pcVar11,zTab,zCol);
            }
          }
          else {
            sqlite3ErrorMsg(pParse,"%s: %s.%s.%s",pcVar11,zDb,zTab,zCol);
          }
          pParse->checkSchema = '\x01';
          pNC->nErr = pNC->nErr + 1;
        }
        if ((-1 < pExpr->iColumn) && (pTopNC != (NameContext *)0x0)) {
          sVar1 = pExpr->iColumn;
          if (0x3f < sVar1) {
            sVar1 = 0x3f;
          }
          pTopNC[1].pAggInfo = (AggInfo *)(1L << ((byte)sVar1 & 0x3f) | (ulong)pTopNC[1].pAggInfo);
        }
        sqlite3ExprDelete(db_00,pExpr->pLeft);
        pExpr->pLeft = (Expr *)0x0;
        sqlite3ExprDelete(db_00,pExpr->pRight);
        pExpr->pRight = (Expr *)0x0;
        uVar7 = 0x98;
        if (bVar6) {
          uVar7 = '<';
        }
        pExpr->op = uVar7;
LAB_001c6378:
        if (nSubquery == 1) {
          pSchema = (Schema *)pNC;
          if (pExpr->op != '\x18') {
            sqlite3AuthRead(pParse,pExpr,pSStack_80,(SrcList *)(pExpr_local->u).zToken);
          }
          for (; *(int *)&(pSchema->idxHash).first = *(int *)&(pSchema->idxHash).first + 1,
              pSchema != (Schema *)pExpr_local; pSchema = *(Schema **)&pSchema->idxHash) {
          }
          pParse_local._4_4_ = 1;
        }
        else {
          pParse_local._4_4_ = 2;
        }
      }
      return pParse_local._4_4_;
    }
    psVar2 = (short *)(pExpr_local->u).zToken;
    if (psVar2 != (short *)0x0) {
      pMatch = (SrcList_item *)(psVar2 + 4);
      for (cnt = 0; cnt < *psVar2; cnt = cnt + 1) {
        pTVar3 = pMatch->pTab;
        if ((pMatch->pSelect == (Select *)0x0) || ((pMatch->pSelect->selFlags & 0x200) == 0)) {
LAB_001c5bd5:
          if ((zDb == (char *)0x0) || (pTVar3->pSchema == pSStack_80)) {
            if (zTab != (char *)0x0) {
              if (pMatch->zAlias == (char *)0x0) {
                local_100 = pTVar3->zName;
              }
              else {
                local_100 = pMatch->zAlias;
              }
              iVar9 = sqlite3_stricmp(local_100,zTab);
              if (iVar9 != 0) goto LAB_001c5d53;
            }
            iVar9 = local_50 + 1;
            if (local_50 == 0) {
              pTopNC = (NameContext *)pMatch;
            }
            cntTab = 0;
            pCStack_a8 = pTVar3->aCol;
            for (; local_50 = iVar9, cntTab < pTVar3->nCol; cntTab = cntTab + 1) {
              iVar10 = sqlite3_stricmp(pCStack_a8->zName,zCol);
              if ((iVar10 == 0) &&
                 ((nSubquery != 1 ||
                  (((pMatch->jointype & 4) == 0 &&
                   (iVar10 = nameInUsingClause(pMatch->pUsing,zCol), iVar10 == 0)))))) {
                nSubquery = nSubquery + 1;
                pTopNC = (NameContext *)pMatch;
                if (cntTab == pTVar3->iPKey) {
                  yVar8 = -1;
                }
                else {
                  yVar8 = (ynVar)cntTab;
                }
                pExpr->iColumn = yVar8;
                break;
              }
              pCStack_a8 = pCStack_a8 + 1;
            }
          }
        }
        else {
          bVar5 = false;
          pEVar4 = pMatch->pSelect->pEList;
          for (cntTab = 0; cntTab < pEVar4->nExpr; cntTab = cntTab + 1) {
            iVar9 = sqlite3MatchSpanName(pEVar4->a[cntTab].zSpan,zCol,zTab,zDb);
            if (iVar9 != 0) {
              nSubquery = nSubquery + 1;
              local_50 = 2;
              pTopNC = (NameContext *)pMatch;
              pExpr->iColumn = (ynVar)cntTab;
              bVar5 = true;
            }
          }
          if ((!bVar5) && (zTab != (char *)0x0)) goto LAB_001c5bd5;
        }
LAB_001c5d53:
        pMatch = pMatch + 1;
      }
      if (pTopNC != (NameContext *)0x0) {
        pExpr->iTable = *(int *)((long)&pTopNC[1].pParse + 4);
        pExpr->pTab = (Table *)pTopNC->pNext;
        pSStack_80 = pExpr->pTab->pSchema;
      }
    }
    if ((((zDb == (char *)0x0) && (zTab != (char *)0x0)) && (nSubquery == 0)) &&
       (pParse->pTriggerTab != (Table *)0x0)) {
      uVar7 = pParse->eTriggerOp;
      pTStack_c8 = (Table *)0x0;
      if ((uVar7 == 'j') || (iVar9 = sqlite3_stricmp("new",zTab), iVar9 != 0)) {
        if ((uVar7 != 'i') && (iVar9 = sqlite3_stricmp("old",zTab), iVar9 == 0)) {
          pExpr->iTable = 0;
          pTStack_c8 = pParse->pTriggerTab;
        }
      }
      else {
        pExpr->iTable = 1;
        pTStack_c8 = pParse->pTriggerTab;
      }
      if (pTStack_c8 != (Table *)0x0) {
        pSStack_80 = pTStack_c8->pSchema;
        local_50 = local_50 + 1;
        for (pCol_1._4_4_ = 0; pCol_1._4_4_ < pTStack_c8->nCol; pCol_1._4_4_ = pCol_1._4_4_ + 1) {
          iVar9 = sqlite3_stricmp(pTStack_c8->aCol[pCol_1._4_4_].zName,zCol);
          if (iVar9 == 0) {
            if (pCol_1._4_4_ == pTStack_c8->iPKey) {
              pCol_1._4_4_ = -1;
            }
            break;
          }
        }
        if ((pTStack_c8->nCol <= pCol_1._4_4_) && (iVar9 = sqlite3IsRowid(zCol), iVar9 != 0)) {
          pCol_1._4_4_ = -1;
        }
        if (pCol_1._4_4_ < pTStack_c8->nCol) {
          nSubquery = 1;
          if (pCol_1._4_4_ < 0) {
            pExpr->affinity = 'd';
          }
          else if (pExpr->iTable == 0) {
            if (pCol_1._4_4_ < 0x20) {
              local_108 = 1 << ((byte)pCol_1._4_4_ & 0x1f);
            }
            else {
              local_108 = 0xffffffff;
            }
            pParse->oldmask = local_108 | pParse->oldmask;
          }
          else {
            if (pCol_1._4_4_ < 0x20) {
              local_10c = 1 << ((byte)pCol_1._4_4_ & 0x1f);
            }
            else {
              local_10c = 0xffffffff;
            }
            pParse->newmask = local_10c | pParse->newmask;
          }
          pExpr->iColumn = (ynVar)pCol_1._4_4_;
          pExpr->pTab = pTStack_c8;
          bVar6 = true;
        }
      }
    }
    if (((nSubquery == 0) && (local_50 == 1)) && (iVar9 = sqlite3IsRowid(zCol), iVar9 != 0)) {
      nSubquery = 1;
      pExpr->iColumn = -1;
      pExpr->affinity = 'd';
    }
    pEList_00 = pExpr_local->pLeft;
    if (((pEList_00 != (Expr *)0x0) && (zTab == (char *)0x0)) &&
       (((pExpr_local->iColumn & 0x10) == 0 || (nSubquery == 0)))) {
      for (cntTab = 0; iVar9._0_1_ = pEList_00->op, iVar9._1_1_ = pEList_00->affinity,
          iVar9._2_2_ = pEList_00->flags, cntTab < iVar9; cntTab = cntTab + 1) {
        pcVar11 = ((ExprList_item *)(pEList_00->u).zToken)[cntTab].zName;
        if ((pcVar11 != (char *)0x0) && (iVar9 = sqlite3_stricmp(pcVar11,zCol), iVar9 == 0)) {
          if (((pExpr_local->iColumn & 1) == 0) &&
             (((((ExprList_item *)(pEList_00->u).zToken)[cntTab].pExpr)->flags & 2) == 2)) {
            sqlite3ErrorMsg(pParse,"misuse of aliased aggregate %s",pcVar11);
            return 2;
          }
          resolveAlias(pParse,(ExprList *)pEList_00,cntTab,pExpr,"",db._4_4_);
          nSubquery = 1;
          goto LAB_001c6378;
        }
      }
    }
    if (nSubquery == 0) {
      pExpr_local = (Expr *)(pExpr_local->x).pList;
      db._4_4_ = db._4_4_ + 1;
    }
  } while( true );
}

Assistant:

static int lookupName(
  Parse *pParse,       /* The parsing context */
  const char *zDb,     /* Name of the database containing table, or NULL */
  const char *zTab,    /* Name of table containing column, or NULL */
  const char *zCol,    /* Name of the column. */
  NameContext *pNC,    /* The name context used to resolve the name */
  Expr *pExpr          /* Make this EXPR node point to the selected column */
){
  int i, j;                         /* Loop counters */
  int cnt = 0;                      /* Number of matching column names */
  int cntTab = 0;                   /* Number of matching table names */
  int nSubquery = 0;                /* How many levels of subquery */
  sqlite3 *db = pParse->db;         /* The database connection */
  struct SrcList_item *pItem;       /* Use for looping over pSrcList items */
  struct SrcList_item *pMatch = 0;  /* The matching pSrcList item */
  NameContext *pTopNC = pNC;        /* First namecontext in the list */
  Schema *pSchema = 0;              /* Schema of the expression */
  int isTrigger = 0;

  assert( pNC );     /* the name context cannot be NULL. */
  assert( zCol );    /* The Z in X.Y.Z cannot be NULL */
  assert( !ExprHasAnyProperty(pExpr, EP_TokenOnly|EP_Reduced) );

  /* Initialize the node to no-match */
  pExpr->iTable = -1;
  pExpr->pTab = 0;
  ExprSetIrreducible(pExpr);

  /* Translate the schema name in zDb into a pointer to the corresponding
  ** schema.  If not found, pSchema will remain NULL and nothing will match
  ** resulting in an appropriate error message toward the end of this routine
  */
  if( zDb ){
    for(i=0; i<db->nDb; i++){
      assert( db->aDb[i].zName );
      if( sqlite3StrICmp(db->aDb[i].zName,zDb)==0 ){
        pSchema = db->aDb[i].pSchema;
        break;
      }
    }
  }

  /* Start at the inner-most context and move outward until a match is found */
  while( pNC && cnt==0 ){
    ExprList *pEList;
    SrcList *pSrcList = pNC->pSrcList;

    if( pSrcList ){
      for(i=0, pItem=pSrcList->a; i<pSrcList->nSrc; i++, pItem++){
        Table *pTab;
        Column *pCol;
  
        pTab = pItem->pTab;
        assert( pTab!=0 && pTab->zName!=0 );
        assert( pTab->nCol>0 );
        if( pItem->pSelect && (pItem->pSelect->selFlags & SF_NestedFrom)!=0 ){
          int hit = 0;
          pEList = pItem->pSelect->pEList;
          for(j=0; j<pEList->nExpr; j++){
            if( sqlite3MatchSpanName(pEList->a[j].zSpan, zCol, zTab, zDb) ){
              cnt++;
              cntTab = 2;
              pMatch = pItem;
              pExpr->iColumn = j;
              hit = 1;
            }
          }
          if( hit || zTab==0 ) continue;
        }
        if( zDb && pTab->pSchema!=pSchema ){
          continue;
        }
        if( zTab ){
          const char *zTabName = pItem->zAlias ? pItem->zAlias : pTab->zName;
          assert( zTabName!=0 );
          if( sqlite3StrICmp(zTabName, zTab)!=0 ){
            continue;
          }
        }
        if( 0==(cntTab++) ){
          pMatch = pItem;
        }
        for(j=0, pCol=pTab->aCol; j<pTab->nCol; j++, pCol++){
          if( sqlite3StrICmp(pCol->zName, zCol)==0 ){
            /* If there has been exactly one prior match and this match
            ** is for the right-hand table of a NATURAL JOIN or is in a 
            ** USING clause, then skip this match.
            */
            if( cnt==1 ){
              if( pItem->jointype & JT_NATURAL ) continue;
              if( nameInUsingClause(pItem->pUsing, zCol) ) continue;
            }
            cnt++;
            pMatch = pItem;
            /* Substitute the rowid (column -1) for the INTEGER PRIMARY KEY */
            pExpr->iColumn = j==pTab->iPKey ? -1 : (i16)j;
            break;
          }
        }
      }
      if( pMatch ){
        pExpr->iTable = pMatch->iCursor;
        pExpr->pTab = pMatch->pTab;
        pSchema = pExpr->pTab->pSchema;
      }
    } /* if( pSrcList ) */

#ifndef SQLITE_OMIT_TRIGGER
    /* If we have not already resolved the name, then maybe 
    ** it is a new.* or old.* trigger argument reference
    */
    if( zDb==0 && zTab!=0 && cnt==0 && pParse->pTriggerTab!=0 ){
      int op = pParse->eTriggerOp;
      Table *pTab = 0;
      assert( op==TK_DELETE || op==TK_UPDATE || op==TK_INSERT );
      if( op!=TK_DELETE && sqlite3StrICmp("new",zTab) == 0 ){
        pExpr->iTable = 1;
        pTab = pParse->pTriggerTab;
      }else if( op!=TK_INSERT && sqlite3StrICmp("old",zTab)==0 ){
        pExpr->iTable = 0;
        pTab = pParse->pTriggerTab;
      }

      if( pTab ){ 
        int iCol;
        pSchema = pTab->pSchema;
        cntTab++;
        for(iCol=0; iCol<pTab->nCol; iCol++){
          Column *pCol = &pTab->aCol[iCol];
          if( sqlite3StrICmp(pCol->zName, zCol)==0 ){
            if( iCol==pTab->iPKey ){
              iCol = -1;
            }
            break;
          }
        }
        if( iCol>=pTab->nCol && sqlite3IsRowid(zCol) ){
          iCol = -1;        /* IMP: R-44911-55124 */
        }
        if( iCol<pTab->nCol ){
          cnt++;
          if( iCol<0 ){
            pExpr->affinity = SQLITE_AFF_INTEGER;
          }else if( pExpr->iTable==0 ){
            testcase( iCol==31 );
            testcase( iCol==32 );
            pParse->oldmask |= (iCol>=32 ? 0xffffffff : (((u32)1)<<iCol));
          }else{
            testcase( iCol==31 );
            testcase( iCol==32 );
            pParse->newmask |= (iCol>=32 ? 0xffffffff : (((u32)1)<<iCol));
          }
          pExpr->iColumn = (i16)iCol;
          pExpr->pTab = pTab;
          isTrigger = 1;
        }
      }
    }
#endif /* !defined(SQLITE_OMIT_TRIGGER) */

    /*
    ** Perhaps the name is a reference to the ROWID
    */
    if( cnt==0 && cntTab==1 && sqlite3IsRowid(zCol) ){
      cnt = 1;
      pExpr->iColumn = -1;     /* IMP: R-44911-55124 */
      pExpr->affinity = SQLITE_AFF_INTEGER;
    }

    /*
    ** If the input is of the form Z (not Y.Z or X.Y.Z) then the name Z
    ** might refer to an result-set alias.  This happens, for example, when
    ** we are resolving names in the WHERE clause of the following command:
    **
    **     SELECT a+b AS x FROM table WHERE x<10;
    **
    ** In cases like this, replace pExpr with a copy of the expression that
    ** forms the result set entry ("a+b" in the example) and return immediately.
    ** Note that the expression in the result set should have already been
    ** resolved by the time the WHERE clause is resolved.
    */
    if( (pEList = pNC->pEList)!=0
     && zTab==0
     && ((pNC->ncFlags & NC_AsMaybe)==0 || cnt==0)
    ){
      for(j=0; j<pEList->nExpr; j++){
        char *zAs = pEList->a[j].zName;
        if( zAs!=0 && sqlite3StrICmp(zAs, zCol)==0 ){
          Expr *pOrig;
          assert( pExpr->pLeft==0 && pExpr->pRight==0 );
          assert( pExpr->x.pList==0 );
          assert( pExpr->x.pSelect==0 );
          pOrig = pEList->a[j].pExpr;
          if( (pNC->ncFlags&NC_AllowAgg)==0 && ExprHasProperty(pOrig, EP_Agg) ){
            sqlite3ErrorMsg(pParse, "misuse of aliased aggregate %s", zAs);
            return WRC_Abort;
          }
          resolveAlias(pParse, pEList, j, pExpr, "", nSubquery);
          cnt = 1;
          pMatch = 0;
          assert( zTab==0 && zDb==0 );
          goto lookupname_end;
        }
      } 
    }

    /* Advance to the next name context.  The loop will exit when either
    ** we have a match (cnt>0) or when we run out of name contexts.
    */
    if( cnt==0 ){
      pNC = pNC->pNext;
      nSubquery++;
    }
  }

  /*
  ** If X and Y are NULL (in other words if only the column name Z is
  ** supplied) and the value of Z is enclosed in double-quotes, then
  ** Z is a string literal if it doesn't match any column names.  In that
  ** case, we need to return right away and not make any changes to
  ** pExpr.
  **
  ** Because no reference was made to outer contexts, the pNC->nRef
  ** fields are not changed in any context.
  */
  if( cnt==0 && zTab==0 && ExprHasProperty(pExpr,EP_DblQuoted) ){
    pExpr->op = TK_STRING;
    pExpr->pTab = 0;
    return WRC_Prune;
  }

  /*
  ** cnt==0 means there was not match.  cnt>1 means there were two or
  ** more matches.  Either way, we have an error.
  */
  if( cnt!=1 ){
    const char *zErr;
    zErr = cnt==0 ? "no such column" : "ambiguous column name";
    if( zDb ){
      sqlite3ErrorMsg(pParse, "%s: %s.%s.%s", zErr, zDb, zTab, zCol);
    }else if( zTab ){
      sqlite3ErrorMsg(pParse, "%s: %s.%s", zErr, zTab, zCol);
    }else{
      sqlite3ErrorMsg(pParse, "%s: %s", zErr, zCol);
    }
    pParse->checkSchema = 1;
    pTopNC->nErr++;
  }

  /* If a column from a table in pSrcList is referenced, then record
  ** this fact in the pSrcList.a[].colUsed bitmask.  Column 0 causes
  ** bit 0 to be set.  Column 1 sets bit 1.  And so forth.  If the
  ** column number is greater than the number of bits in the bitmask
  ** then set the high-order bit of the bitmask.
  */
  if( pExpr->iColumn>=0 && pMatch!=0 ){
    int n = pExpr->iColumn;
    testcase( n==BMS-1 );
    if( n>=BMS ){
      n = BMS-1;
    }
    assert( pMatch->iCursor==pExpr->iTable );
    pMatch->colUsed |= ((Bitmask)1)<<n;
  }

  /* Clean up and return
  */
  sqlite3ExprDelete(db, pExpr->pLeft);
  pExpr->pLeft = 0;
  sqlite3ExprDelete(db, pExpr->pRight);
  pExpr->pRight = 0;
  pExpr->op = (isTrigger ? TK_TRIGGER : TK_COLUMN);
lookupname_end:
  if( cnt==1 ){
    assert( pNC!=0 );
    if( pExpr->op!=TK_AS ){
      sqlite3AuthRead(pParse, pExpr, pSchema, pNC->pSrcList);
    }
    /* Increment the nRef value on all name contexts from TopNC up to
    ** the point where the name matched. */
    for(;;){
      assert( pTopNC!=0 );
      pTopNC->nRef++;
      if( pTopNC==pNC ) break;
      pTopNC = pTopNC->pNext;
    }
    return WRC_Prune;
  } else {
    return WRC_Abort;
  }
}